

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_tls12_handle_hs_message_post_handshake(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  size_t sVar2;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->conf->endpoint == '\0') &&
     ((*ssl->in_msg != '\0' ||
      (sVar1 = ssl->in_hslen, sVar2 = mbedtls_ssl_hs_hdr_len(ssl), sVar1 != sVar2)))) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x15c5,"handshake received (not HelloRequest)");
    if (ssl->conf->transport == '\x01') {
      ssl_local._4_4_ = 0;
    }
    else {
      ssl_local._4_4_ = -0x7700;
    }
  }
  else if ((ssl->conf->endpoint == '\x01') && (*ssl->in_msg != '\x01')) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x15d4,"handshake received (not ClientHello)");
    if (ssl->conf->transport == '\x01') {
      ssl_local._4_4_ = 0;
    }
    else {
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x15ff,"refusing renegotiation, sending alert");
    ssl_local._4_4_ = mbedtls_ssl_send_alert_message(ssl,'\x01','d');
    if (ssl_local._4_4_ == 0) {
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_tls12_handle_hs_message_post_handshake(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /*
     * - For client-side, expect SERVER_HELLO_REQUEST.
     * - For server-side, expect CLIENT_HELLO.
     * - Fail (TLS) or silently drop record (DTLS) in other cases.
     */

#if defined(MBEDTLS_SSL_CLI_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        (ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_REQUEST ||
         ssl->in_hslen  != mbedtls_ssl_hs_hdr_len(ssl))) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("handshake received (not HelloRequest)"));

        /* With DTLS, drop the packet (probably from last handshake) */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            return 0;
        }
#endif
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }
#endif /* MBEDTLS_SSL_CLI_C */

#if defined(MBEDTLS_SSL_SRV_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ssl->in_msg[0] != MBEDTLS_SSL_HS_CLIENT_HELLO) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("handshake received (not ClientHello)"));

        /* With DTLS, drop the packet (probably from last handshake) */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            return 0;
        }
#endif
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }
#endif /* MBEDTLS_SSL_SRV_C */

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    /* Determine whether renegotiation attempt should be accepted */
    if (!(ssl->conf->disable_renegotiation == MBEDTLS_SSL_RENEGOTIATION_DISABLED ||
          (ssl->secure_renegotiation == MBEDTLS_SSL_LEGACY_RENEGOTIATION &&
           ssl->conf->allow_legacy_renegotiation ==
           MBEDTLS_SSL_LEGACY_NO_RENEGOTIATION))) {
        /*
         * Accept renegotiation request
         */

        /* DTLS clients need to know renego is server-initiated */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
            ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT) {
            ssl->renego_status = MBEDTLS_SSL_RENEGOTIATION_PENDING;
        }
#endif
        ret = mbedtls_ssl_start_renegotiation(ssl);
        if (ret != MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO &&
            ret != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_start_renegotiation",
                                  ret);
            return ret;
        }
    } else
#endif /* MBEDTLS_SSL_RENEGOTIATION */
    {
        /*
         * Refuse renegotiation
         */

        MBEDTLS_SSL_DEBUG_MSG(3, ("refusing renegotiation, sending alert"));

        if ((ret = mbedtls_ssl_send_alert_message(ssl,
                                                  MBEDTLS_SSL_ALERT_LEVEL_WARNING,
                                                  MBEDTLS_SSL_ALERT_MSG_NO_RENEGOTIATION)) != 0) {
            return ret;
        }
    }

    return 0;
}